

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Builder * __thiscall
capnp::_::ListBuilder::asText(Builder *__return_storage_ptr__,ListBuilder *this)

{
  ulong uVar1;
  
  if ((this->structDataSize == 8) && (this->structPointerCount == 0)) {
    uVar1 = (ulong)this->elementCount;
    if (uVar1 == 0) {
      asText((ListBuilder *)__return_storage_ptr__);
    }
    else if (this->ptr[uVar1 - 1] == '\0') {
      (__return_storage_ptr__->content).ptr = (char *)this->ptr;
      (__return_storage_ptr__->content).size_ = uVar1;
    }
    else {
      asText((ListBuilder *)__return_storage_ptr__);
    }
  }
  else {
    asText((ListBuilder *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Text::Builder ListBuilder::asText() {
  KJ_REQUIRE(structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS,
             "Expected Text, got list of non-bytes.") {
    return Text::Builder();
  }

  size_t size = unbound(elementCount / ELEMENTS);

  KJ_REQUIRE(size > 0, "Message contains text that is not NUL-terminated.") {
    return Text::Builder();
  }

  char* cptr = reinterpret_cast<char*>(ptr);
  --size;  // NUL terminator

  KJ_REQUIRE(cptr[size] == '\0', "Message contains text that is not NUL-terminated.") {
    return Text::Builder();
  }

  return Text::Builder(cptr, size);
}